

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

char * read_cfg_line(cfg_file *cfg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int local_20;
  int i;
  int ch;
  cfg_file *cfg_local;
  
  do {
    if (cfg->cache_on != 0) break;
    local_20 = 0;
    while( true ) {
      iVar1 = fgetc((FILE *)cfg->file);
      if ((local_20 == 0) && (iVar1 == -1)) {
        return (char *)0x0;
      }
      if (((iVar1 == -1) || (iVar2 = feof((FILE *)cfg->file), iVar2 != 0)) || (iVar1 == 10)) break;
      cfg->cache[local_20] = (char)iVar1;
      local_20 = local_20 + 1;
    }
    cfg->cache[local_20] = '\0';
  } while (cfg->cache[0] == '#');
  cfg->cache_on = 1;
  pcVar3 = string_trim(cfg->cache);
  return pcVar3;
}

Assistant:

static char *read_cfg_line(struct cfg_file *cfg)
{
    int ch;
    int i;

    while (!cfg->cache_on) {
        i = 0;

        while (1) {
            ch = fgetc(cfg->file);
            if (i == 0 && ch == EOF)
                return NULL;
            else if (ch == EOF || feof(cfg->file) || ch == '\n')
                break;

            cfg->cache[i++] = ch;
        }
        cfg->cache[i] = '\0';

        /* a note, ignore and get the next line */
        if (cfg->cache[0] != '#')
            break;
    }

    cfg->cache_on = 1;
    return string_trim(cfg->cache);
}